

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

Point2f __thiscall pbrt::StratifiedSampler::Get2D(StratifiedSampler *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  uint64_t uVar6;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar7 [16];
  undefined1 auVar11 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  uVar6 = MixBits((long)*(int *)(Options + 4) ^
                  (long)this->dimension << 0x10 ^
                  (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.y << 0x20 ^
                  (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.x << 0x30);
  this->dimension = this->dimension + 2;
  iVar5 = PermutationElement(this->sampleIndex,this->yPixelSamples * this->xPixelSamples,
                             (uint32_t)uVar6);
  iVar3 = this->xPixelSamples;
  bVar4 = this->jitter;
  auVar7 = SUB6416(ZEXT464(0x3f000000),0);
  if ((bool)bVar4 == true) {
    auVar10._0_4_ = RNG::Uniform<float>(&this->rng);
    auVar10._4_60_ = extraout_var;
    bVar4 = this->jitter;
    auVar7 = auVar10._0_16_;
  }
  auVar8 = SUB6416(ZEXT464(0x3f000000),0);
  if ((bVar4 & 1) != 0) {
    auVar11._0_4_ = RNG::Uniform<float>(&this->rng);
    auVar11._4_60_ = extraout_var_00;
    auVar8 = auVar11._0_16_;
  }
  auVar8 = vinsertps_avx(auVar7,auVar8,0x10);
  auVar7 = vpinsrd_avx(ZEXT416((uint)(iVar5 % iVar3)),iVar5 / iVar3,1);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar9._0_4_ = auVar8._0_4_ + auVar7._0_4_;
  auVar9._4_4_ = auVar8._4_4_ + auVar7._4_4_;
  auVar9._8_4_ = auVar8._8_4_ + auVar7._8_4_;
  auVar9._12_4_ = auVar8._12_4_ + auVar7._12_4_;
  uVar1 = this->xPixelSamples;
  uVar2 = this->yPixelSamples;
  auVar7._4_4_ = uVar2;
  auVar7._0_4_ = uVar1;
  auVar7._8_8_ = 0;
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vdivps_avx(auVar9,auVar7);
  return (Point2f)auVar7._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        uint64_t hash = MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                                ((uint64_t)dimension << 16) ^ GetOptions().seed);
        dimension += 2;

        int stratum = PermutationElement(sampleIndex, SamplesPerPixel(), hash);
        int x = stratum % xPixelSamples;
        int y = stratum / xPixelSamples;
        Float dx = jitter ? rng.Uniform<Float>() : 0.5f;
        Float dy = jitter ? rng.Uniform<Float>() : 0.5f;
        return {(x + dx) / xPixelSamples, (y + dy) / yPixelSamples};
    }